

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_HRR_Writer::WriteHRR_Ket_Inline_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  int iVar1;
  int *piVar2;
  char (*in_RDX) [2];
  char *in_RDI;
  string *in_stack_00000008;
  string *in_stack_00000010;
  string *in_stack_00000018;
  HRRDoubletStepList *in_stack_00000020;
  ostream *in_stack_00000028;
  OSTEI_HRR_Writer *in_stack_00000030;
  HRRDoubletStepList ketsteps;
  string bra_str;
  string ncart_bra_str;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar3;
  undefined8 in_stack_fffffffffffffe58;
  allocator *paVar4;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  DAM *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffea8;
  allocator local_121;
  string local_120 [16];
  DAM *in_stack_fffffffffffffef0;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffef8;
  string local_c0 [55];
  allocator local_89;
  string local_88 [76];
  int local_3c;
  string local_38 [56];
  
  QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c);
  QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  DAM::DAM((DAM *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
           (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58,
           (string *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  iVar1 = NCART(in_stack_fffffffffffffe70);
  local_3c = iVar1;
  StringBuilder<int>((int *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  DAM::~DAM((DAM *)0x14e1b0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c);
  QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c);
  StringBuilder<char,char_const(&)[2],char_const&>
            (in_RDI,in_RDX,(char *)CONCAT44(iVar1,in_stack_fffffffffffffea8));
  piVar2 = QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe4c);
  iVar1 = *piVar2;
  piVar2 = QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe4c);
  iVar3 = *piVar2;
  paVar4 = &local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",paVar4);
  DAM::DAM((DAM *)CONCAT44(iVar1,in_stack_fffffffffffffe60),(int)((ulong)paVar4 >> 0x20),(int)paVar4
           ,(string *)CONCAT44(iVar3,in_stack_fffffffffffffe50));
  OSTEI_HRR_Algorithm_Base::GetKetSteps(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  DAM::~DAM((DAM *)0x14e310);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  WriteKetSteps_(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                 in_stack_00000010,in_stack_00000008);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffe60));
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Ket_Inline_(std::ostream & os, QAM am) const
{
    // ncart_bra in string form
    std::string ncart_bra_str = StringBuilder(NCART(DAM{am[0], am[1]}));

    // the bra part in string form
    std::string bra_str = StringBuilder(amchar[am[0]], "_", amchar[am[1]]);

    auto ketsteps = hrr_algo_.GetKetSteps(DAM{am[2], am[3]});
    WriteKetSteps_(os, ketsteps, am.tag, ncart_bra_str, bra_str);
}